

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::SingleVertexArrayNormalizeGroup::init
          (SingleVertexArrayNormalizeGroup *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  GLValue max_;
  bool bVar1;
  undefined8 *puVar2;
  long *plVar3;
  MultiVertexArrayTest *this_00;
  vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
  *pvVar4;
  int **ppiVar5;
  int iVar6;
  int *piVar7;
  undefined8 uVar8;
  bool bVar9;
  long lVar10;
  GLValue GVar11;
  Spec spec;
  string name;
  ArraySpec arraySpec;
  int local_124;
  undefined1 local_120 [16];
  pointer local_110;
  pointer pAStack_108;
  pointer local_100;
  long *local_f8;
  undefined8 local_f0;
  long local_e8;
  undefined8 uStack_e0;
  string local_d8;
  SingleVertexArrayNormalizeGroup *local_b8;
  undefined1 local_b0 [16];
  int *local_a0;
  long lStack_98;
  string local_70;
  InputType local_50;
  undefined4 uStack_4c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_48;
  InputType local_40;
  undefined4 uStack_3c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_38;
  
  local_124 = 2;
  local_b8 = this;
  do {
    lVar10 = 0;
    bVar1 = true;
    do {
      bVar9 = bVar1;
      if (this->m_type == INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
        if (local_124 == 4) {
          iVar6 = 4;
LAB_0116c5de:
          typeToString<int>(&local_70,iVar6);
          puVar2 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1a9adba);
          pvVar4 = (vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                    *)(puVar2 + 2);
          if ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
               *)*puVar2 == pvVar4) {
            local_110 = *(pointer *)pvVar4;
            pAStack_108 = (pointer)puVar2[3];
            local_120._0_8_ =
                 (vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                  *)&local_110;
          }
          else {
            local_110 = *(pointer *)pvVar4;
            local_120._0_8_ =
                 (vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                  *)*puVar2;
          }
          local_120._8_8_ = puVar2[1];
          *puVar2 = pvVar4;
          puVar2[1] = 0;
          *(undefined1 *)(puVar2 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append(local_120);
          this = local_b8;
          ppiVar5 = (int **)(plVar3 + 2);
          if ((int **)*plVar3 == ppiVar5) {
            local_a0 = *ppiVar5;
            lStack_98 = plVar3[3];
            local_b0._0_8_ = &local_a0;
          }
          else {
            local_a0 = *ppiVar5;
            local_b0._0_8_ = (int **)*plVar3;
          }
          local_b0._8_8_ = plVar3[1];
          *plVar3 = (long)ppiVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          iVar6 = (&DAT_01bc2920)[lVar10];
          typeToString<int>(&local_d8,iVar6);
          piVar7 = (int *)0xf;
          if ((int **)local_b0._0_8_ != &local_a0) {
            piVar7 = local_a0;
          }
          if (piVar7 < (int *)(local_d8._M_string_length + local_b0._8_8_)) {
            uVar8 = (int *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              uVar8 = local_d8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar8 < (int *)(local_d8._M_string_length + local_b0._8_8_))
            goto LAB_0116c72a;
            puVar2 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,local_b0._0_8_);
          }
          else {
LAB_0116c72a:
            puVar2 = (undefined8 *)
                     std::__cxx11::string::_M_append(local_b0,(ulong)local_d8._M_dataplus._M_p);
          }
          plVar3 = puVar2 + 2;
          if ((long *)*puVar2 == plVar3) {
            local_e8 = *plVar3;
            uStack_e0 = puVar2[3];
            local_f8 = &local_e8;
          }
          else {
            local_e8 = *plVar3;
            local_f8 = (long *)*puVar2;
          }
          local_f0 = puVar2[1];
          *puVar2 = plVar3;
          puVar2[1] = 0;
          *(undefined1 *)plVar3 = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if ((int **)local_b0._0_8_ != &local_a0) {
            operator_delete((void *)local_b0._0_8_,(long)local_a0 + 1);
          }
          if ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
               *)local_120._0_8_ !=
              (vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
               *)&local_110) {
            operator_delete((void *)local_120._0_8_,(ulong)((long)&local_110->inputType + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          type = this->m_type;
          GVar11 = deqp::gls::GLValue::getMinValue(type);
          aStack_38 = GVar11.field_1;
          local_40 = GVar11.type;
          GVar11 = deqp::gls::GLValue::getMaxValue(this->m_type);
          aStack_48 = GVar11.field_1;
          local_50 = GVar11.type;
          max_._4_4_ = uStack_4c;
          max_.type = local_50;
          GVar11._4_4_ = uStack_3c;
          GVar11.type = local_40;
          GVar11.field_1 = aStack_38;
          max_.field_1 = aStack_48;
          deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                    ((ArraySpec *)local_b0,type,OUTPUTTYPE_VEC4,STORAGE_USER,USAGE_DYNAMIC_DRAW,
                     local_124,0,0,true,GVar11,max_);
          local_110 = (pointer)0x0;
          pAStack_108 = (pointer)0x0;
          local_100 = (pointer)0x0;
          local_120._4_4_ = iVar6;
          local_120._0_4_ = PRIMITIVE_TRIANGLES;
          local_120._8_8_ = local_120._8_8_ & 0xffffffff00000000;
          std::
          vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
          ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                    ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                      *)&local_110,(iterator)0x0,(ArraySpec *)local_b0);
          this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
          deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                    (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,
                     (Spec *)local_120,(char *)local_f8,(char *)local_f8);
          tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
          if (local_110 != (pointer)0x0) {
            operator_delete(local_110,(long)local_100 - (long)local_110);
          }
          if (local_f8 != &local_e8) {
            operator_delete(local_f8,local_e8 + 1);
          }
        }
      }
      else {
        iVar6 = local_124;
        if (local_124 == 4 || this->m_type != INPUTTYPE_INT_2_10_10_10) goto LAB_0116c5de;
      }
      lVar10 = 1;
      bVar1 = false;
    } while (bVar9);
    local_124 = local_124 + 1;
    if (local_124 == 5) {
      return 5;
    }
  } while( true );
}

Assistant:

void SingleVertexArrayNormalizeGroup::init (void)
{
	int					counts[]		= {1, 256};

	for (int componentCount = 2; componentCount < 5; componentCount++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			if((m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10) && componentCount != 4)
				continue;

			std::string name = "components" + typeToString(componentCount) + "_quads" + typeToString(counts[countNdx]);

			MultiVertexArrayTest::Spec::ArraySpec arraySpec(m_type,
															Array::OUTPUTTYPE_VEC4,
															Array::STORAGE_USER,
															Array::USAGE_DYNAMIC_DRAW,
															componentCount,
															0,
															0,
															true,
															GLValue::getMinValue(m_type),
															GLValue::getMaxValue(m_type));

			MultiVertexArrayTest::Spec spec;
			spec.primitive	= Array::PRIMITIVE_TRIANGLES;
			spec.drawCount	= counts[countNdx];
			spec.first		= 0;
			spec.arrays.push_back(arraySpec);

			addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
		}
	}
}